

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineShaderStageCreateInfo *pStages,uint32_t stageCount,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  VkSpecializationMapEntry *pVVar1;
  VkPipelineShaderStageCreateInfo *pVVar2;
  bool bVar3;
  DynamicStateInfo *dynamic_state_info;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *size;
  VkPipelineShaderStageCreateInfo *t;
  long lVar4;
  ulong uVar5;
  uint32_t j;
  ulong uVar6;
  Value spec;
  Value map_entries;
  Value stage;
  Data local_148;
  Data *local_138;
  VkPipelineShaderStageCreateInfo *local_130;
  Value map_entry;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  GenericStringRef<char> local_60;
  string local_50;
  
  local_148.n.i64 = (Number)0x0;
  local_148.s.str = (Ch *)0x4000000000000;
  uVar5 = 0;
  local_138 = &out_value->data_;
  local_130 = pStages;
  for (; pVVar2 = local_130, uVar5 != stageCount; uVar5 = uVar5 + 1) {
    t = local_130 + uVar5;
    stage.data_.n = (Number)0x0;
    stage.data_.s.str = (Ch *)0x3000000000000;
    local_70.s = "flags";
    local_70.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&stage,&local_70,local_130[uVar5].flags,alloc);
    local_80.s = "name";
    local_80.length = 4;
    rapidjson::GenericStringRef<char>::GenericStringRef(&local_60,pVVar2[uVar5].pName);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&stage,&local_80,&local_60,alloc);
    local_90.s = "module";
    local_90.length = 6;
    uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Fossilize *)&spec,(uint64_t)pVVar2[uVar5].module,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember(&stage,&local_90,&spec,alloc);
    local_a0.s = "stage";
    local_a0.length = 5;
    dynamic_state_info = (DynamicStateInfo *)alloc;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkShaderStageFlagBits>(&stage,&local_a0,pVVar2[uVar5].stage,alloc);
    if (pVVar2[uVar5].pSpecializationInfo != (VkSpecializationInfo *)0x0) {
      spec.data_.n = (Number)0x0;
      spec.data_.s.str = (Ch *)0x3000000000000;
      local_b0.s = "dataSize";
      local_b0.length = 8;
      size = alloc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_long>
                (&spec,&local_b0,(pVVar2[uVar5].pSpecializationInfo)->dataSize,alloc);
      local_c0.s = "data";
      local_c0.length = 4;
      encode_base64_abi_cxx11_
                (&local_50,(Fossilize *)t->pSpecializationInfo->pData,
                 (void *)t->pSpecializationInfo->dataSize,(size_t)size);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      AddMember<std::__cxx11::string>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)&spec,&local_c0,&local_50,alloc);
      std::__cxx11::string::_M_dispose();
      map_entries.data_.n = (Number)0x0;
      map_entries.data_.s.str = (Ch *)0x4000000000000;
      lVar4 = 8;
      for (uVar6 = 0; uVar6 < t->pSpecializationInfo->mapEntryCount; uVar6 = uVar6 + 1) {
        pVVar1 = t->pSpecializationInfo->pMapEntries;
        map_entry.data_.n = (Number)0x0;
        map_entry.data_.s.str = (Ch *)0x3000000000000;
        local_d0.s = "offset";
        local_d0.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&map_entry,&local_d0,*(uint *)((long)pVVar1 + lVar4 + -4),alloc);
        local_e0.s = "size";
        local_e0.length = 4;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_long>
                  (&map_entry,&local_e0,*(unsigned_long *)((long)&pVVar1->constantID + lVar4),alloc)
        ;
        local_f0.s = "constantID";
        local_f0.length = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&map_entry,&local_f0,*(uint *)((long)pVVar1 + lVar4 + -8),alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&map_entries,&map_entry,alloc);
        lVar4 = lVar4 + 0x10;
      }
      local_100.s = "mapEntries";
      local_100.length = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&spec,&local_100,&map_entries,alloc);
      local_110.s = "specializationInfo";
      local_110.length = 0x12;
      dynamic_state_info = (DynamicStateInfo *)alloc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&stage,&local_110,&spec,alloc);
    }
    bVar3 = pnext_chain_add_json_value<VkPipelineShaderStageCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (&stage,t,alloc,dynamic_state_info);
    if (!bVar3) goto LAB_001568b1;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_148.s,&stage,alloc);
  }
  if (&local_148 != local_138) {
    local_138->n = (int64_t)local_148.n;
    (&local_138->n)[1].i64 = (int64_t)local_148.s.str;
  }
LAB_001568b1:
  return stageCount <= uVar5;
}

Assistant:

static bool json_value(const VkPipelineShaderStageCreateInfo *pStages, uint32_t stageCount,
                       Allocator &alloc, Value *out_value)
{
	Value stages(kArrayType);
	for (uint32_t i = 0; i < stageCount; i++)
	{
		auto &s = pStages[i];
		Value stage(kObjectType);
		stage.AddMember("flags", s.flags, alloc);
		stage.AddMember("name", StringRef(s.pName), alloc);
		stage.AddMember("module", uint64_string(api_object_cast<uint64_t>(s.module), alloc), alloc);
		stage.AddMember("stage", s.stage, alloc);
		if (s.pSpecializationInfo)
		{
			Value spec(kObjectType);
			spec.AddMember("dataSize", uint64_t(s.pSpecializationInfo->dataSize), alloc);
			spec.AddMember("data",
			               encode_base64(s.pSpecializationInfo->pData,
			                             s.pSpecializationInfo->dataSize), alloc);
			Value map_entries(kArrayType);
			for (uint32_t j = 0; j < s.pSpecializationInfo->mapEntryCount; j++)
			{
				auto &e = s.pSpecializationInfo->pMapEntries[j];
				Value map_entry(kObjectType);
				map_entry.AddMember("offset", e.offset, alloc);
				map_entry.AddMember("size", uint64_t(e.size), alloc);
				map_entry.AddMember("constantID", e.constantID, alloc);
				map_entries.PushBack(map_entry, alloc);
			}
			spec.AddMember("mapEntries", map_entries, alloc);
			stage.AddMember("specializationInfo", spec, alloc);
		}

		if (!pnext_chain_add_json_value(stage, s, alloc, nullptr))
			return false;
		stages.PushBack(stage, alloc);
	}

	*out_value = stages;
	return true;
}